

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O0

string * __thiscall
miniros::console::FixedMapToken::getString_abi_cxx11_
          (FixedMapToken *this,void *param_2,Level param_3,char *param_4,char *param_5,char *param_6
          ,int param_7)

{
  bool bVar1;
  char *in_RSI;
  string *in_RDI;
  iterator it;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffff28;
  char *in_stack_ffffffffffffff30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  string local_80 [32];
  string local_60 [32];
  _Self local_40;
  _Self local_38 [7];
  
  local_38[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(in_stack_ffffffffffffff28,(key_type *)0x3ed5af);
  local_40._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(in_stack_ffffffffffffff28);
  bVar1 = std::operator==(local_38,&local_40);
  if (bVar1) {
    std::operator+(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    std::operator+(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
    std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff70,in_RSI,(allocator<char> *)in_RDI);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff73);
    std::__cxx11::string::~string(local_60);
    std::__cxx11::string::~string(local_80);
  }
  else {
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x3ed6c2);
    std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff70,in_RSI,(allocator<char> *)in_RDI);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff72);
  }
  return in_RDI;
}

Assistant:

virtual std::string getString(void*, console::Level, const char*, const char*, const char*, int)
  {
    M_string::iterator it = g_extra_fixed_tokens.find(str_);
    if (it == g_extra_fixed_tokens.end())
    {
      return ("${" + str_ + "}").c_str();
    }

    return it->second.c_str();
  }